

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O2

bool Kernel::MatchingUtils::
     matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
               (Term *base,Term *instance,Binder *binder)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_2_f154dc0f_for_Term_10 this;
  Term *this_00;
  Term *__addr;
  bool bVar3;
  int iVar4;
  TermList base_00;
  Term *pTVar5;
  uint uVar6;
  Binder *in_RCX;
  TermList *pTVar7;
  TermList *pTVar8;
  Literal *l2;
  Literal *l1;
  Term *pTVar9;
  
  uVar2 = base->_args[0]._content;
  if ((((uVar2 & 8) != 0) && ((instance->_args[0]._content & 8) != 0)) &&
     (in_RCX = (Binder *)(ulong)base->_weight, instance->_weight < base->_weight)) {
    return false;
  }
  if (((uVar2 & 0x10) != 0) && (*(int *)&base->field_0xc < 0)) {
    this = base->field_9;
    base_00 = SortHelper::getEqualityArgumentSort((Literal *)instance);
    bVar3 = matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                      ((MatchingUtils *)this,base_00,(TermList)binder,in_RCX);
    if (!bVar3) {
      return false;
    }
  }
  uVar6 = *(uint *)&base->field_0xc;
  uVar1 = *(uint *)&instance->field_0xc;
  if ((matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder&)
       ::subterms == '\0') &&
     (iVar4 = __cxa_guard_acquire(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder&)
                                   ::subterms), iVar4 != 0)) {
    Lib::Stack<Kernel::TermList_*>::Stack
              (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                ::subterms,0x20);
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,
                 &matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                  ::subterms,&__dso_handle);
    __cxa_guard_release(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder&)
                         ::subterms);
  }
  pTVar7 = base->_args + (uVar6 & 0xfffffff);
  pTVar8 = instance->_args + (uVar1 & 0xfffffff);
  matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>::
  subterms._cursor =
       matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
       ::subterms._stack;
  do {
    while( true ) {
      if ((((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar7 + -1))->_vars & 3) != 2) {
        Lib::Stack<Kernel::TermList_*>::push
                  (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                    ::subterms,&((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar8 + -1))->_sort);
        Lib::Stack<Kernel::TermList_*>::push
                  (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
                    ::subterms,&((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar7 + -1))->_sort);
      }
      this_00 = (Term *)pTVar7->_content;
      __addr = (Term *)pTVar8->_content;
      pTVar5 = this_00;
      pTVar9 = __addr;
      if (((uint)this_00 & 3) != 3) break;
LAB_002ad053:
      *(Term **)((long)&((binder->_parent->_specVars)._array)->_content +
                ((ulong)pTVar5 & 0x3fffffffc) * 2) = pTVar9;
LAB_002ad06b:
      if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
          ::subterms._cursor ==
          matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
          ::subterms._stack) {
        return true;
      }
      pTVar7 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
               ::subterms._cursor[-1];
      pTVar8 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
               ::subterms._cursor[-2];
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
      ::subterms._cursor =
           matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder>
           ::subterms._cursor + -2;
    }
    uVar6 = (uint)__addr & 3;
    pTVar5 = __addr;
    pTVar9 = this_00;
    if (uVar6 == 3) goto LAB_002ad053;
    if (((ulong)this_00 & 3) != 0) {
      iVar4 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder
              ::bind(binder,(int)((ulong)this_00 >> 2),(sockaddr *)__addr,uVar6);
      if ((char)iVar4 == '\0') {
        return false;
      }
      goto LAB_002ad06b;
    }
    if (((ulong)__addr & 3) != 0) {
      return false;
    }
    if (this_00->_functor != __addr->_functor) {
      return false;
    }
    if (((this_00->_args[0]._content & 8) != 0) && ((__addr->_args[0]._content & 8) != 0)) {
      bVar3 = Term::ground(this_00);
      if ((bVar3) && (pTVar7->_content != pTVar8->_content)) {
        return false;
      }
      if (__addr->_weight < this_00->_weight) {
        return false;
      }
    }
    if ((*(uint *)&this_00->field_0xc & 0xfffffff) == 0) goto LAB_002ad06b;
    pTVar7 = this_00->_args + ((ulong)*(uint *)&this_00->field_0xc & 0xfffffff);
    pTVar8 = __addr->_args + (*(uint *)&__addr->field_0xc & 0xfffffff);
  } while( true );
}

Assistant:

bool MatchingUtils::matchArgs(Term* base, Term* instance, Binder& binder)
{
  ASS_EQ(base->functor(),instance->functor());
  if(base->shared() && instance->shared()) {
    if(base->weight() > instance->weight()) {
      return false;
    }
  }
  // Note: while this function only cares about the term structure,
  // for two-variable equalities we need to get the sort of the arguments from the Literal object.
  if(base->isLiteral() && static_cast<Literal*>(base)->isTwoVarEquality()){
    Literal* l1 = static_cast<Literal*>(base);
    Literal* l2 = static_cast<Literal*>(instance);
    if(!matchTerms(l1->twoVarEqSort(), SortHelper::getEqualityArgumentSort(l2), binder)){
      return false;
    }
  }
  ASS_G(base->arity(),0);

  TermList* bt=base->args();
  TermList* it=instance->args();

  static Stack<TermList*> subterms(32);
  subterms.reset();

  for (;;) {
    if (!bt->next()->isEmpty()) {
      subterms.push(it->next());
      subterms.push(bt->next());
    }
    if(bt->isSpecialVar()) {
      binder.specVar(bt->var(), *it);
    } else if(it->isSpecialVar()) {
      binder.specVar(it->var(), *bt);
    } else if(bt->isTerm()) {
      if(!it->isTerm()) {
	return false;
      }
      Term* s = bt->term();
      Term* t = it->term();
      if(s->functor()!=t->functor()) {
	return false;
      }
      if(bt->term()->shared() && it->term()->shared()) {
	if(bt->term()->ground() && *bt!=*it) {
	  return false;
	}
	if(s->weight() > t->weight()) {
	  return false;
	}
      }
      if(s->arity() > 0) {
	bt = s->args();
	it = t->args();
	continue;
      }
    } else {
      ASS(bt->isOrdinaryVar());
      if(!binder.bind(bt->var(), *it)) {
	return false;
      }
    }
    if(subterms.isEmpty()) {
      return true;
    }
    bt = subterms.pop();
    it = subterms.pop();
  }
}